

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O3

reference __thiscall
slang::
SmallVectorBase<std::variant<slang::ast::LValue::BitSlice,_slang::ast::LValue::ElementIndex,_slang::ast::LValue::ArraySlice,_slang::ast::LValue::ArrayLookup>_>
::emplace_back<slang::ast::LValue::BitSlice>
          (SmallVectorBase<std::variant<slang::ast::LValue::BitSlice,_slang::ast::LValue::ElementIndex,_slang::ast::LValue::ArraySlice,_slang::ast::LValue::ArrayLookup>_>
           *this,BitSlice *args)

{
  ulong uVar1;
  _Move_ctor_base<false,_slang::ast::LValue::BitSlice,_slang::ast::LValue::ElementIndex,_slang::ast::LValue::ArraySlice,_slang::ast::LValue::ArrayLookup>
  *p_Var2;
  size_type sVar3;
  _Move_ctor_base<false,_slang::ast::LValue::BitSlice,_slang::ast::LValue::ElementIndex,_slang::ast::LValue::ArraySlice,_slang::ast::LValue::ArrayLookup>
  *p_Var4;
  ConstantRange *ctx;
  ConstantRange *pCVar5;
  ConstantRange *__rhs;
  ConstantRange *__rhs_00;
  long lVar6;
  
  __rhs_00 = (ConstantRange *)(this->data_ + this->len);
  if (this->len != this->cap) {
    *__rhs_00 = args->range;
    *(undefined1 *)&__rhs_00[10].left = 0;
    sVar3 = this->len;
    this->len = sVar3 + 1;
    return this->data_ + sVar3;
  }
  if (this->len == 0x1745d1745d1745d) {
    detail::throwLengthError();
  }
  pCVar5 = (ConstantRange *)(this->len + 1);
  uVar1 = this->cap;
  ctx = (ConstantRange *)(uVar1 * 2);
  if (pCVar5 < ctx) {
    pCVar5 = ctx;
  }
  if (0x1745d1745d1745d - uVar1 < uVar1) {
    pCVar5 = (ConstantRange *)0x1745d1745d1745d;
  }
  lVar6 = (long)__rhs_00 - (long)this->data_;
  p_Var2 = (_Move_ctor_base<false,_slang::ast::LValue::BitSlice,_slang::ast::LValue::ElementIndex,_slang::ast::LValue::ArraySlice,_slang::ast::LValue::ArrayLookup>
            *)operator_new((long)pCVar5 * 0x58);
  *(ConstantRange *)((long)p_Var2 + lVar6) = args->range;
  *(undefined1 *)((long)p_Var2 + lVar6 + 0x50) = 0;
  __rhs = (ConstantRange *)this->data_;
  sVar3 = this->len;
  if (__rhs + sVar3 * 0xb == __rhs_00) {
    p_Var4 = p_Var2;
    if (sVar3 != 0) {
      do {
        ctx = __rhs;
        std::__detail::__variant::
        _Move_ctor_base<false,_slang::ast::LValue::BitSlice,_slang::ast::LValue::ElementIndex,_slang::ast::LValue::ArraySlice,_slang::ast::LValue::ArrayLookup>
        ::_Move_ctor_base(p_Var4,(_Move_ctor_base<false,_slang::ast::LValue::BitSlice,_slang::ast::LValue::ElementIndex,_slang::ast::LValue::ArraySlice,_slang::ast::LValue::ArrayLookup>
                                  *)__rhs);
        __rhs = __rhs + 0xb;
        p_Var4 = p_Var4 + 1;
      } while (__rhs != __rhs_00);
    }
  }
  else {
    p_Var4 = p_Var2;
    if (__rhs != __rhs_00) {
      do {
        ctx = __rhs;
        std::__detail::__variant::
        _Move_ctor_base<false,_slang::ast::LValue::BitSlice,_slang::ast::LValue::ElementIndex,_slang::ast::LValue::ArraySlice,_slang::ast::LValue::ArrayLookup>
        ::_Move_ctor_base(p_Var4,(_Move_ctor_base<false,_slang::ast::LValue::BitSlice,_slang::ast::LValue::ElementIndex,_slang::ast::LValue::ArraySlice,_slang::ast::LValue::ArrayLookup>
                                  *)__rhs);
        __rhs = __rhs + 0xb;
        p_Var4 = p_Var4 + 1;
      } while (__rhs != __rhs_00);
      __rhs = (ConstantRange *)this->data_;
      sVar3 = this->len;
    }
    if (__rhs + sVar3 * 0xb != __rhs_00) {
      p_Var4 = (_Move_ctor_base<false,_slang::ast::LValue::BitSlice,_slang::ast::LValue::ElementIndex,_slang::ast::LValue::ArraySlice,_slang::ast::LValue::ArrayLookup>
                *)(lVar6 + (long)p_Var2);
      do {
        p_Var4 = p_Var4 + 1;
        ctx = __rhs_00;
        std::__detail::__variant::
        _Move_ctor_base<false,_slang::ast::LValue::BitSlice,_slang::ast::LValue::ElementIndex,_slang::ast::LValue::ArraySlice,_slang::ast::LValue::ArrayLookup>
        ::_Move_ctor_base(p_Var4,(_Move_ctor_base<false,_slang::ast::LValue::BitSlice,_slang::ast::LValue::ElementIndex,_slang::ast::LValue::ArraySlice,_slang::ast::LValue::ArrayLookup>
                                  *)__rhs_00);
        __rhs_00 = __rhs_00 + 0xb;
      } while (__rhs_00 != __rhs + sVar3 * 0xb);
    }
  }
  cleanup(this,(EVP_PKEY_CTX *)ctx);
  this->len = this->len + 1;
  this->cap = (size_type)pCVar5;
  this->data_ = (pointer)p_Var2;
  return (reference)((long)p_Var2 + lVar6);
}

Assistant:

reference emplace_back(Args&&... args) {
        if (len == cap)
            return *emplaceRealloc(end(), std::forward<Args>(args)...);

        new (end()) T(std::forward<Args>(args)...);
        len++;
        return back();
    }